

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLeSample * __thiscall
pbrt::UniformInfiniteLight::SampleLe
          (LightLeSample *__return_storage_ptr__,UniformInfiniteLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar8;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  undefined1 auVar16 [64];
  undefined1 auVar18 [56];
  undefined1 auVar17 [64];
  float fVar19;
  float fVar20;
  float fVar23;
  float fVar24;
  float fVar26;
  undefined1 auVar21 [16];
  undefined1 auVar25 [56];
  undefined1 auVar22 [64];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  SampledSpectrum SVar39;
  float local_a8;
  float fStack_a4;
  undefined1 extraout_var [60];
  
  fVar1 = (u1->super_Tuple2<pbrt::Point2,_float>).x;
  fVar8 = (u1->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar14 = cosf(fVar8);
  auVar16._0_4_ = sinf(fVar8);
  auVar16._4_60_ = extraout_var;
  fVar8 = (u2->super_Tuple2<pbrt::Point2,_float>).x;
  fVar15 = (u2->super_Tuple2<pbrt::Point2,_float>).y;
  auVar9._0_4_ = fVar8 + fVar8;
  auVar9._4_4_ = fVar15 + fVar15;
  auVar9._8_8_ = 0;
  auVar31._8_4_ = 0xbf800000;
  auVar31._0_8_ = 0xbf800000bf800000;
  auVar31._12_4_ = 0xbf800000;
  auVar9 = vaddps_avx512vl(auVar9,auVar31);
  fVar15 = auVar9._0_4_;
  auVar31 = vmovshdup_avx(auVar9);
  fVar8 = auVar31._0_4_;
  if (fVar15 == 0.0) {
    auVar31 = ZEXT816(0) << 0x40;
    if ((fVar8 == 0.0) && (!NAN(fVar8))) goto LAB_00372bc8;
  }
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar9,auVar10);
  auVar32._0_4_ = fVar15 / fVar8;
  auVar32._4_12_ = auVar9._4_12_;
  auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar32,ZEXT416(0x3fc90fdb));
  auVar31 = vshufps_avx(auVar10,auVar10,0xf5);
  bVar5 = auVar31._0_4_ < auVar10._0_4_;
  fVar7 = (float)((uint)bVar5 * (int)((fVar8 / fVar15) * 0.7853982) + (uint)!bVar5 * auVar9._0_4_);
  fVar8 = (float)((uint)bVar5 * (int)fVar15 + (uint)!bVar5 * (int)fVar8);
  fVar15 = cosf(fVar7);
  fVar7 = sinf(fVar7);
  auVar31 = vinsertps_avx(ZEXT416((uint)(fVar8 * fVar15)),ZEXT416((uint)(fVar8 * fVar7)),0x10);
LAB_00372bc8:
  fVar8 = this->sceneRadius;
  fVar15 = this->scale;
  auVar34._8_4_ = 0x80000000;
  auVar34._0_8_ = 0x8000000080000000;
  auVar34._12_4_ = 0x80000000;
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar9 = vfmadd132ss_fma(ZEXT416((uint)fVar1),auVar12,ZEXT416(0xc0000000));
  fVar27 = auVar9._0_4_;
  auVar36._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
  auVar36._8_4_ = auVar9._8_4_ ^ 0x80000000;
  auVar36._12_4_ = auVar9._12_4_ ^ 0x80000000;
  auVar11 = vpternlogd_avx512vl(auVar36,auVar12,auVar34,0xec);
  auVar9 = vfnmadd231ss_fma(auVar12,auVar9,auVar9);
  auVar9 = vmaxss_avx(auVar9,ZEXT416(0) << 0x20);
  fVar35 = auVar11._0_4_;
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  fVar19 = -1.0 / (fVar35 - fVar27);
  fVar14 = auVar9._0_4_ * fVar14;
  uVar2 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar4 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar38._0_4_ = -fVar14;
  auVar38._4_4_ = 0x80000000;
  auVar38._8_4_ = 0x80000000;
  auVar38._12_4_ = 0x80000000;
  auVar9 = vinsertps_avx(auVar38,auVar9,0x1c);
  auVar10 = vinsertps_avx(auVar11,auVar16._0_16_,0x1c);
  fVar20 = auVar10._0_4_ * auVar9._0_4_;
  fVar23 = auVar10._4_4_ * auVar9._4_4_;
  fVar24 = auVar10._8_4_ * auVar9._8_4_;
  fVar26 = auVar10._12_4_ * auVar9._12_4_;
  fVar7 = auVar31._0_4_;
  auVar21._0_4_ = fVar20 * fVar7;
  auVar21._4_4_ = fVar23 * auVar31._4_4_;
  auVar21._8_4_ = fVar24 * auVar31._8_4_;
  auVar21._12_4_ = fVar26 * auVar31._12_4_;
  auVar10 = vmovshdup_avx(auVar21);
  auVar25 = (undefined1  [56])0x0;
  fVar1 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar18 = (undefined1  [56])0x0;
  SVar39 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar13 = _DAT_004a9df0;
  auVar22._0_8_ = SVar39.values.values._8_8_;
  auVar22._8_56_ = auVar25;
  auVar17._0_8_ = SVar39.values.values._0_8_;
  auVar17._8_56_ = auVar18;
  auVar6._4_4_ = fVar23;
  auVar6._0_4_ = fVar20;
  auVar6._8_4_ = fVar24;
  auVar6._12_4_ = fVar26;
  auVar9 = vmovlhps_avx(auVar17._0_16_,auVar22._0_16_);
  auVar32 = vmovshdup_avx(auVar6);
  (__return_storage_ptr__->L).values.values[0] = auVar9._0_4_ * fVar15;
  (__return_storage_ptr__->L).values.values[1] = auVar9._4_4_ * fVar15;
  (__return_storage_ptr__->L).values.values[2] = auVar9._8_4_ * fVar15;
  (__return_storage_ptr__->L).values.values[3] = auVar9._12_4_ * fVar15;
  fVar15 = fVar19 * fVar14 * auVar32._0_4_;
  auVar12 = vpermi2ps_avx512vl(auVar13,ZEXT416((uint)(fVar35 * fVar15)),ZEXT416((uint)fVar15));
  auVar9 = vshufps_avx(auVar31,auVar31,0xe1);
  auVar29._4_4_ = fVar19;
  auVar29._0_4_ = fVar19;
  auVar29._8_4_ = fVar19;
  auVar29._12_4_ = fVar19;
  auVar33._8_4_ = 0x3f800000;
  auVar33._0_8_ = 0x3f8000003f800000;
  auVar33._12_4_ = 0x3f800000;
  auVar28._0_4_ = fVar20 * auVar38._0_4_;
  auVar28._4_4_ = fVar23 * fVar23;
  auVar28._8_4_ = fVar24 * fVar24;
  auVar28._12_4_ = fVar26 * fVar26;
  auVar32 = vunpcklps_avx(auVar33,auVar11);
  auVar37._4_12_ = auVar6._4_12_;
  auVar37._0_4_ = fVar14;
  auVar32 = vfmadd231ps_fma(auVar32,auVar28,auVar29);
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar13 = vmulps_avx512vl(auVar37,auVar13);
  auVar30._0_4_ = fVar14 * fVar8;
  auVar30._4_4_ = fVar23 * fVar8;
  auVar30._8_4_ = fVar24 * fVar8;
  auVar30._12_4_ = fVar26 * fVar8;
  auVar11._0_4_ =
       fVar8 * (auVar12._0_4_ * auVar9._0_4_ + fVar7 * auVar32._0_4_ + auVar13._0_4_) + (float)uVar2
  ;
  auVar11._4_4_ =
       fVar8 * (auVar12._4_4_ * auVar9._4_4_ + auVar31._4_4_ * auVar32._4_4_ + auVar13._4_4_) +
       (float)uVar4;
  auVar11._8_4_ =
       fVar8 * (auVar12._8_4_ * auVar9._8_4_ + auVar31._8_4_ * auVar32._8_4_ + auVar13._8_4_) + 0.0;
  auVar11._12_4_ =
       fVar8 * (auVar12._12_4_ * auVar9._12_4_ + auVar31._12_4_ * auVar32._12_4_ + auVar13._12_4_) +
       0.0;
  auVar31 = vsubps_avx(auVar11,auVar30);
  uVar3 = vmovlps_avx(auVar31);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       (fVar8 * (fVar14 * fVar35 * fVar7 + auVar10._0_4_ + fVar27 * -0.0) + fVar1) - fVar27 * fVar8;
  uVar3 = vmovlps_avx(auVar37);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = fVar27;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0 / (fVar8 * fVar8 * 3.1415927);
  __return_storage_ptr__->pdfDir = 0.07957747;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample UniformInfiniteLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                             SampledWavelengths &lambda,
                                             Float time) const {
    Vector3f w = SampleUniformSphere(u1);
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute probabilities for uniform infinite light
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
    Float pdfDir = UniformSpherePDF();

    return LightLeSample(scale * Lemit.Sample(lambda), ray, pdfPos, pdfDir);
}